

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

QDebug qt_QMetaEnum_debugOperator(QDebug *dbg,qint64 value,QMetaObject *meta,char *name)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  Stream *pSVar4;
  bool bVar5;
  int index;
  char *pcVar6;
  QDebug *pQVar7;
  char *t;
  char16_t *t_00;
  char *in_R8;
  long in_FS_OFFSET;
  QMetaEnum local_50;
  QDebugStateSaver saver;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)value);
  *(undefined1 *)(*(long *)value + 0x30) = 0;
  index = QMetaObject::indexOfEnumerator((QMetaObject *)name,in_R8);
  local_50 = QMetaObject::enumerator((QMetaObject *)name,index);
  uVar2 = *(uint *)(*(long *)value + 0x34);
  if (1 < (int)uVar2) {
    pcVar6 = QMetaEnum::scope(&local_50);
    if (pcVar6 != (char *)0x0) {
      pQVar7 = QDebug::operator<<((QDebug *)value,pcVar6);
      QDebug::operator<<(pQVar7,L"::");
    }
  }
  pcVar6 = QMetaEnum::valueToKey(&local_50,(long)(int)meta);
  bVar5 = QMetaEnum::isScoped(&local_50);
  if ((pcVar6 == (char *)0x0) || ((uVar2 & 1) != 0 || bVar5)) {
    t = QMetaEnum::enumName(&local_50);
    pQVar7 = QDebug::operator<<((QDebug *)value,t);
    t_00 = L"::";
    if (pcVar6 == (char *)0x0) {
      t_00 = L"(";
    }
    QDebug::operator<<(pQVar7,t_00);
    if (pcVar6 == (char *)0x0) {
      pQVar7 = QDebug::operator<<((QDebug *)value,(qint64)meta);
      QDebug::operator<<(pQVar7,')');
      goto LAB_002109d7;
    }
  }
  QDebug::operator<<((QDebug *)value,pcVar6);
LAB_002109d7:
  pSVar4 = *(Stream **)value;
  dbg->stream = pSVar4;
  piVar1 = &pSVar4->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QDebug)(Stream *)dbg;
  }
  __stack_chk_fail();
}

Assistant:

QDebug qt_QMetaEnum_debugOperator(QDebug &dbg, qint64 value, const QMetaObject *meta, const char *name)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const int verbosity = dbg.verbosity();
    if (verbosity >= QDebug::DefaultVerbosity) {
        if (const char *scope = me.scope())
            dbg << scope << u"::";
    }

    const char *key = me.valueToKey(static_cast<int>(value));
    const bool scoped = me.isScoped() || verbosity & 1;
    if (scoped || !key)
        dbg << me.enumName() << (!key ? u"(" : u"::");

    if (key)
        dbg << key;
    else
        dbg << value << ')';

    return dbg;
}